

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBaseVS::Run(BasicStdLayoutBaseVS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  undefined4 extraout_var;
  void *pvVar4;
  byte bVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  allocator<char> local_79;
  void *local_78;
  void *pvStack_70;
  long local_68;
  string local_58;
  string local_38;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  lVar8 = 0x10;
  if (bVar1) {
    local_78 = (void *)0x0;
    pvStack_70 = (void *)0x0;
    local_68 = 0;
    iVar2 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,(char *)CONCAT44(extraout_var,iVar2),&local_79);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,0x1af8059);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_58,&local_38);
    this->m_program = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar8 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_buffer);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                 (long)pvStack_70 - (long)local_78,(allocator_type *)&local_38);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,(long)pvStack_70 - (long)local_78,local_58._M_dataplus._M_p,0x88e4);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,(long)pvStack_70 - (long)local_78,local_78,0x88e4);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer[1]);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glGetBufferSubData
                (this_00,0x90d2,0,(long)pvStack_70 - (long)local_78,local_58._M_dataplus._M_p);
      if (pvStack_70 == local_78) {
        uVar7 = 0;
      }
      else {
        bVar5 = 1;
        uVar7 = 0;
        pvVar4 = local_78;
        pvVar6 = pvStack_70;
        do {
          if (*(char *)((long)pvVar4 + uVar7) != local_58._M_dataplus._M_p[uVar7]) {
            anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n");
            bVar5 = 0;
            pvVar4 = local_78;
            pvVar6 = pvStack_70;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)pvVar6 - (long)pvVar4));
        uVar7 = (ulong)(~bVar5 & 1);
      }
      if (local_58._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_58._M_dataplus._M_p,
                        local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
      }
      lVar8 = -uVar7;
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data;
		const char*			 glsl_vs = GetInput(in_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		// output buffer
		std::vector<GLubyte> out_data(in_data.size());
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &out_data[0], GL_STATIC_DRAW);

		// input buffer
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &in_data[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[1]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data.size(), &out_data[0]);

		bool status = true;
		for (size_t i = 0; i < in_data.size(); ++i)
		{
			if (in_data[i] != out_data[i])
			{
				Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i], in_data[i]);
				status = false;
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}